

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int exprCompareVariable(Parse *pParse,Expr *pVar,Expr *pExpr)

{
  u32 *puVar1;
  short sVar2;
  sqlite3_value *pMem2;
  int iVar3;
  sqlite3_value *pVal;
  uint uVar4;
  u8 aff;
  ValueNewStat4Ctx *in_R9;
  long in_FS_OFFSET;
  sqlite3_value *pR;
  sqlite3_value *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = (Mem *)0x0;
  if ((pExpr->op != 0x9d) || (iVar3 = 0, pVar->iColumn != pExpr->iColumn)) {
    iVar3 = 2;
    if ((pParse->db->flags & 0x800000) == 0) {
      valueFromExpr(pParse->db,pExpr,'\x01','A',&local_38,in_R9);
      pMem2 = local_38;
      if (local_38 != (Mem *)0x0) {
        sVar2 = pVar->iColumn;
        uVar4 = 0x80000000;
        if (sVar2 < 0x20) {
          uVar4 = 1 << ((char)sVar2 - 1U & 0x1f);
        }
        puVar1 = &pParse->pVdbe->expmask;
        *puVar1 = *puVar1 | uVar4;
        pVal = sqlite3VdbeGetBoundValue(pParse->pReprepare,(int)sVar2,aff);
        if (pVal == (sqlite3_value *)0x0) {
          iVar3 = 2;
        }
        else {
          uVar4._0_2_ = pVal->flags;
          uVar4._2_1_ = pVal->enc;
          uVar4._3_1_ = pVal->eSubtype;
          if ((0x4000000040004U >> ((ulong)uVar4 & 0x3f) & 1) != 0) {
            sqlite3ValueText(pVal,'\x01');
          }
          iVar3 = sqlite3MemCompare(pVal,pMem2,(CollSeq *)0x0);
          iVar3 = (uint)(iVar3 != 0) * 2;
        }
        sqlite3ValueFree(pMem2);
        sqlite3ValueFree(pVal);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return iVar3;
  }
  __stack_chk_fail();
}

Assistant:

static SQLITE_NOINLINE int exprCompareVariable(
  const Parse *pParse,
  const Expr *pVar,
  const Expr *pExpr
){
  int res = 2;
  int iVar;
  sqlite3_value *pL, *pR = 0;

  if( pExpr->op==TK_VARIABLE && pVar->iColumn==pExpr->iColumn ){
    return 0;
  }
  if( (pParse->db->flags & SQLITE_EnableQPSG)!=0 ) return 2;
  sqlite3ValueFromExpr(pParse->db, pExpr, SQLITE_UTF8, SQLITE_AFF_BLOB, &pR);
  if( pR ){
    iVar = pVar->iColumn;
    sqlite3VdbeSetVarmask(pParse->pVdbe, iVar);
    pL = sqlite3VdbeGetBoundValue(pParse->pReprepare, iVar, SQLITE_AFF_BLOB);
    if( pL ){
      if( sqlite3_value_type(pL)==SQLITE_TEXT ){
        sqlite3_value_text(pL); /* Make sure the encoding is UTF-8 */
      }
      res = sqlite3MemCompare(pL, pR, 0) ? 2 : 0;
    }
    sqlite3ValueFree(pR);
    sqlite3ValueFree(pL);
  }
  return res;
}